

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Variable __thiscall LiteScript::ClassObject::GetMember(ClassObject *this,char *name)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  char *in_RDX;
  uint *extraout_RDX;
  Variable VVar5;
  uint local_24;
  uint sz;
  uint i;
  char *name_local;
  ClassObject *this_local;
  uint *puVar4;
  
  local_24 = 0;
  sVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                  *)name);
  do {
    if ((uint)sVar2 <= local_24) {
      VVar5 = Class::GetUnstaticMember((Class *)this,*(char **)(name + 0x38));
      puVar4 = VVar5.nb_ref;
LAB_0017d420:
      VVar5.nb_ref = puVar4;
      VVar5.obj = (Object *)this;
      return VVar5;
    }
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                           *)name,(ulong)local_24);
    bVar1 = std::operator==(&pvVar3->first,in_RDX);
    if (bVar1) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                             *)name,(ulong)local_24);
      Variable::Variable((Variable *)this,&pvVar3->second);
      puVar4 = extraout_RDX;
      goto LAB_0017d420;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

LiteScript::Variable LiteScript::ClassObject::GetMember(const char *name) {
    for (unsigned int i = 0, sz = this->members.size(); i < sz; i++) {
        if (this->members[i].first == name)
            return Variable(this->members[i].second);
    }
    return this->ClassBase->GetUnstaticMember(name);
}